

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::sse42::InstanceArrayIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  RTCFormat RVar4;
  InstanceArray *this;
  RTCRayQueryContext *pRVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  RawBufferView *pRVar8;
  undefined1 auVar9 [16];
  Accel *pAVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint auVar15 [1];
  uint auVar23 [1];
  undefined1 auVar17 [12];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar28;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar27 [16];
  undefined1 auVar29 [12];
  float fVar33;
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 in_XMM4 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar42;
  undefined1 auVar43 [16];
  undefined1 auVar45 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar54 [12];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar61;
  undefined1 in_XMM7 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar60 [16];
  float fVar64;
  float fVar65;
  float fVar68;
  float fVar69;
  undefined1 in_XMM8 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  undefined1 in_XMM9 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 in_XMM10 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 in_XMM14 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  float fVar92;
  RayQueryContext newcontext;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float local_118;
  float local_88;
  float fStack_84;
  float fStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  RTCRayQueryContext RVar16;
  undefined1 auVar26 [16];
  
  auVar45 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar10 = InstanceArray::getObject(this,(ulong)prim->primID_);
  auVar54 = in_XMM7._0_12_;
  if (((pAVar10 != (Accel *)0x0) && (((ray->super_RayK<1>).mask & (this->super_Geometry).mask) != 0)
      ) && (pRVar5 = context->user, pRVar5->instID[0] == 0xffffffff)) {
    auVar15[0] = (*prim).primID_;
    auVar23[0] = (*prim).instID_;
    RVar16.instPrimID[0] = auVar15[0];
    RVar16.instID[0] = auVar23[0];
    auVar21._8_8_ = 0;
    auVar21._0_4_ = (float)auVar23[0];
    auVar21._4_4_ = (float)auVar15[0];
    *pRVar5 = RVar16;
    uVar11 = (ulong)prim->primID_;
    if ((this->super_Geometry).numTimeSteps == 1) {
      pRVar6 = (this->l2w_buf).items;
      RVar4 = pRVar6->format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
          in_XMM10 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
          in_XMM4 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
          in_XMM3 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
          in_XMM2 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM10._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 4);
          in_XMM10._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          in_XMM10._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
          in_XMM10._12_4_ = 0;
          in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
          in_XMM4._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0xc);
          in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
          in_XMM4._12_4_ = 0;
          in_XMM3._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          in_XMM3._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          in_XMM3._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          in_XMM3._12_4_ = 0;
          in_XMM2._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x28);
          in_XMM2._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x24);
          in_XMM2._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x28) >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
          auVar21 = insertps(auVar39,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
          auVar73._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
          auVar73._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          auVar73._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
          auVar73._12_4_ = 0;
          auVar32._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar32._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar32._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar32._12_4_ = 0;
          fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
          fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
          fVar25 = *(float *)(pcVar7 + lVar12 + 0x2c);
          fVar28 = *(float *)(pcVar7 + lVar12 + 0x30);
          fVar64 = fVar28 * fVar28 + fVar25 * fVar25 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar89 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
          fVar50 = auVar89._0_4_;
          auVar58._4_12_ = auVar89._4_12_;
          fVar50 = fVar50 * fVar50 * fVar64 * -0.5 * fVar50 + fVar50 * 1.5;
          in_XMM2 = insertps(auVar32,ZEXT416((uint)(fVar44 * fVar50)),0x30);
          in_XMM10 = insertps(auVar73,ZEXT416((uint)(fVar24 * fVar50)),0x30);
          auVar58._0_4_ = fVar50 * fVar28;
          auVar89 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
          in_XMM3 = insertps(auVar21,auVar58,0x30);
          auVar21 = insertps(auVar89,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
          in_XMM4 = insertps(auVar21,ZEXT416((uint)(fVar25 * fVar50)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM10 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          in_XMM4 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
          in_XMM3 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
          in_XMM2 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30);
        }
        fVar64 = in_XMM2._8_4_;
        fVar44 = in_XMM2._12_4_;
        fVar34 = in_XMM10._12_4_;
        fVar33 = in_XMM4._4_4_;
        fVar28 = in_XMM4._12_4_;
        fVar79 = in_XMM3._8_4_;
        fVar25 = in_XMM3._12_4_;
        fVar72 = fVar34 * fVar28 + fVar25 * fVar44;
        fVar50 = fVar34 * fVar28 - fVar25 * fVar44;
        fVar52 = fVar44 * fVar44 + fVar34 * fVar34 + -fVar28 * fVar28 + -fVar25 * fVar25;
        fVar80 = fVar44 * fVar44 - fVar34 * fVar34;
        fVar70 = fVar28 * fVar28 + fVar80 + -fVar25 * fVar25;
        fVar61 = fVar34 * fVar25 - fVar28 * fVar44;
        fVar24 = fVar28 * fVar44 + fVar34 * fVar25;
        fVar63 = fVar28 * fVar25 + fVar34 * fVar44;
        fVar44 = fVar28 * fVar25 - fVar34 * fVar44;
        fVar72 = fVar72 + fVar72;
        fVar61 = fVar61 + fVar61;
        fVar65 = in_XMM10._0_4_;
        fVar34 = fVar25 * fVar25 + fVar80 + -fVar28 * fVar28;
        fVar53 = fVar52 * 1.0 + fVar72 * 0.0 + fVar61 * 0.0;
        fVar62 = fVar52 * 0.0 + fVar72 * 1.0 + fVar61 * 0.0;
        fVar51 = fVar52 * 0.0 + fVar72 * 0.0 + fVar61 * 1.0;
        fVar61 = fVar52 * 0.0 + fVar72 * 0.0 + fVar61 * 0.0;
        fVar63 = fVar63 + fVar63;
        fVar50 = fVar50 + fVar50;
        fVar52 = fVar50 * 1.0 + fVar70 * 0.0 + fVar63 * 0.0;
        fVar72 = fVar50 * 0.0 + fVar70 * 1.0 + fVar63 * 0.0;
        fVar80 = fVar50 * 0.0 + fVar70 * 0.0 + fVar63 * 1.0;
        fVar70 = fVar50 * 0.0 + fVar70 * 0.0 + fVar63 * 0.0;
        auVar66._0_8_ = in_XMM10._4_8_;
        auVar66._8_8_ = 0;
        auVar89 = blendps(auVar66,in_XMM4,4);
        fVar24 = fVar24 + fVar24;
        fVar44 = fVar44 + fVar44;
        fVar25 = fVar24 * 1.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar28 = fVar24 * 0.0 + fVar44 * 1.0 + fVar34 * 0.0;
        fVar50 = fVar24 * 0.0 + fVar44 * 0.0 + fVar34 * 1.0;
        fVar24 = fVar24 * 0.0 + fVar44 * 0.0 + fVar34 * 0.0;
        fVar34 = fVar24 * 0.0;
        in_XMM14._0_4_ = fVar65 * fVar53 + fVar52 * 0.0 + fVar25 * 0.0;
        in_XMM14._4_4_ = fVar65 * fVar62 + fVar72 * 0.0 + fVar28 * 0.0;
        in_XMM14._8_4_ = fVar65 * fVar51 + fVar80 * 0.0 + fVar50 * 0.0;
        in_XMM14._12_4_ = fVar65 * fVar61 + fVar70 * 0.0 + fVar34;
        fVar44 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar44 * fVar53 + fVar33 * fVar52 + fVar25 * 0.0;
        in_XMM1._4_4_ = fVar44 * fVar62 + fVar33 * fVar72 + fVar28 * 0.0;
        in_XMM1._8_4_ = fVar44 * fVar51 + fVar33 * fVar80 + fVar50 * 0.0;
        in_XMM1._12_4_ = fVar44 * fVar61 + fVar33 * fVar70 + fVar34;
        fVar33 = in_XMM3._4_4_;
        fVar44 = in_XMM3._0_4_;
        auVar21._0_4_ = fVar44 * fVar53 + fVar33 * fVar52 + fVar79 * fVar25;
        auVar21._4_4_ = fVar44 * fVar62 + fVar33 * fVar72 + fVar79 * fVar28;
        auVar21._8_4_ = fVar44 * fVar51 + fVar33 * fVar80 + fVar79 * fVar50;
        auVar21._12_4_ = fVar44 * fVar61 + fVar33 * fVar70 + fVar79 * fVar24;
        fVar24 = in_XMM2._4_4_;
        fVar44 = in_XMM2._0_4_;
        auVar45._0_4_ = fVar44 * fVar53 + fVar24 * fVar52 + fVar64 * fVar25 + auVar89._0_4_ + 0.0;
        auVar45._4_4_ = fVar44 * fVar62 + fVar24 * fVar72 + fVar64 * fVar28 + auVar89._4_4_ + 0.0;
        auVar45._8_4_ = fVar44 * fVar51 + fVar24 * fVar80 + fVar64 * fVar50 + auVar89._8_4_ + 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar12 = uVar11 * pRVar6->stride;
        auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                           *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
        in_XMM14 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
        auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                           *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
        in_XMM1 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
        auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                           *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
        auVar21 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
        auVar89 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                           *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
        auVar89 = insertps(auVar89,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
        auVar45 = auVar89._0_12_;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar12 = uVar11 * pRVar6->stride;
        in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar12 + 4);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12);
        in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
        in_XMM14._12_4_ = 0.0;
        in_XMM1._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
        in_XMM1._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12 + 0xc);
        in_XMM1._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
        in_XMM1._12_4_ = 0.0;
        auVar21._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
        auVar21._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12 + 0x18);
        auVar21._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
        auVar21._12_4_ = 0.0;
        auVar45._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar12 + 0x28);
        auVar45._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12 + 0x24);
        auVar45._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x28) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar12 = uVar11 * pRVar6->stride;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
        auVar21 = insertps(auVar18,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
        auVar87._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
        auVar87._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
        auVar87._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
        auVar87._12_4_ = 0;
        auVar46._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
        auVar46._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
        auVar46._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
        auVar46._12_4_ = 0;
        fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
        fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
        fVar25 = *(float *)(pcVar7 + lVar12 + 0x2c);
        fVar28 = *(float *)(pcVar7 + lVar12 + 0x30);
        fVar64 = fVar28 * fVar28 + fVar25 * fVar25 + fVar44 * fVar44 + fVar24 * fVar24;
        auVar89 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
        fVar50 = auVar89._0_4_;
        auVar55._4_12_ = auVar89._4_12_;
        fVar50 = fVar50 * fVar50 * fVar64 * -0.5 * fVar50 + fVar50 * 1.5;
        auVar89 = insertps(auVar46,ZEXT416((uint)(fVar44 * fVar50)),0x30);
        auVar45 = auVar89._0_12_;
        in_XMM14 = insertps(auVar87,ZEXT416((uint)(fVar24 * fVar50)),0x30);
        auVar55._0_4_ = fVar50 * fVar28;
        auVar89 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                           *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
        auVar21 = insertps(auVar21,auVar55,0x30);
        auVar89 = insertps(auVar89,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
        in_XMM1 = insertps(auVar89,ZEXT416((uint)(fVar25 * fVar50)),0x30);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar12 = uVar11 * pRVar6->stride;
        in_XMM14 = *(undefined1 (*) [16])(pcVar7 + lVar12);
        in_XMM1 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
        auVar21 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
        auVar45 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30),0);
      }
    }
    else {
      fVar44 = (this->super_Geometry).fnumTimeSegments;
      fVar24 = (this->super_Geometry).time_range.lower;
      auVar29._0_4_ = (this->super_Geometry).time_range.upper - fVar24;
      auVar29._4_8_ = 0;
      fVar25 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar24) / auVar29._0_4_) * fVar44;
      auVar89 = roundss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar25),9);
      fVar44 = fVar44 + -1.0;
      if (fVar44 <= auVar89._0_4_) {
        auVar89._0_4_ = fVar44;
      }
      auVar17 = ZEXT812(0);
      if (0.0 <= auVar89._0_4_) {
        auVar17._4_8_ = 0;
        auVar17._0_4_ = auVar89._0_4_;
      }
      auVar38._12_4_ = 0;
      auVar38._0_12_ = auVar17;
      uVar13 = (uint)auVar17._0_4_;
      fVar25 = fVar25 - auVar17._0_4_;
      pRVar8 = (this->l2w_buf).items;
      pRVar6 = pRVar8 + uVar13;
      RVar4 = pRVar8[uVar13].format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
          _local_168 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
          _local_138 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
          _local_178 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
          _local_148 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          local_168._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 4);
          local_168._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          fStack_160 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
          fStack_15c = 0.0;
          local_138._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
          local_138._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0xc);
          fStack_130 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
          fStack_12c = 0.0;
          local_178._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          local_178._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          fStack_170 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          fStack_16c = 0.0;
          local_148._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x28);
          local_148._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x24);
          fStack_140 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x28) >> 0x20);
          fStack_13c = 0.0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          auVar71._8_8_ = 0;
          auVar71._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
          auVar89 = insertps(auVar71,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
          auVar59._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
          auVar59._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          auVar59._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
          auVar59._12_4_ = 0;
          auVar74._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar74._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar74._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar74._12_4_ = 0;
          fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
          fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
          fVar28 = *(float *)(pcVar7 + lVar12 + 0x2c);
          fVar50 = *(float *)(pcVar7 + lVar12 + 0x30);
          fVar79 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar21 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
          fVar64 = auVar21._0_4_;
          auVar77._4_12_ = auVar21._4_12_;
          fVar64 = fVar64 * fVar64 * fVar79 * -0.5 * fVar64 + fVar64 * 1.5;
          in_XMM10 = insertps(auVar74,ZEXT416((uint)(fVar44 * fVar64)),0x30);
          in_XMM7 = insertps(auVar59,ZEXT416((uint)(fVar24 * fVar64)),0x30);
          auVar77._0_4_ = fVar64 * fVar50;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
          in_XMM9 = insertps(auVar89,auVar77,0x30);
          auVar21 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
          in_XMM8 = insertps(auVar21,ZEXT416((uint)(fVar28 * fVar64)),0x30);
          _local_178 = in_XMM9;
          _local_168 = in_XMM7;
          _local_148 = in_XMM10;
          _local_138 = in_XMM8;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          _local_168 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          _local_138 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
          _local_178 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
          _local_148 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30);
        }
        pRVar6 = pRVar8 + (uVar13 + 1);
        RVar4 = pRVar8[uVar13 + 1].format;
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
          in_XMM7 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
          in_XMM9 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
          in_XMM8 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
          in_XMM10 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 4);
          in_XMM7._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
          in_XMM7._12_4_ = 0;
          in_XMM9._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
          in_XMM9._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0xc);
          in_XMM9._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
          in_XMM9._12_4_ = 0;
          in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          in_XMM8._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          in_XMM8._12_4_ = 0;
          in_XMM10._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x28);
          in_XMM10._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x24);
          in_XMM10._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x28) >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
          auVar89 = insertps(auVar67,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
          auVar60._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
          auVar60._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          auVar60._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
          auVar60._12_4_ = 0;
          auVar75._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar75._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar75._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar75._12_4_ = 0;
          fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
          fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
          fVar28 = *(float *)(pcVar7 + lVar12 + 0x2c);
          fVar50 = *(float *)(pcVar7 + lVar12 + 0x30);
          fVar79 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar21 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
          fVar64 = auVar21._0_4_;
          auVar43._4_12_ = auVar21._4_12_;
          fVar64 = fVar64 * fVar64 * fVar79 * -0.5 * fVar64 + fVar64 * 1.5;
          in_XMM10 = insertps(auVar75,ZEXT416((uint)(fVar44 * fVar64)),0x30);
          in_XMM7 = insertps(auVar60,ZEXT416((uint)(fVar24 * fVar64)),0x30);
          auVar43._0_4_ = fVar64 * fVar50;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
          in_XMM8 = insertps(auVar89,auVar43,0x30);
          auVar21 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
          in_XMM9 = insertps(auVar21,ZEXT416((uint)(fVar28 * fVar64)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM7 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          in_XMM9 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
          in_XMM8 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
          in_XMM10 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30);
        }
        local_128 = in_XMM10._12_4_;
        local_118 = in_XMM7._12_4_;
        fVar50 = in_XMM9._12_4_;
        fVar28 = in_XMM8._12_4_;
        fVar24 = fStack_16c * fVar28 +
                 fStack_12c * fVar50 + fStack_13c * local_128 + fStack_15c * local_118;
        fVar44 = -fVar24;
        if (fVar24 < fVar44) {
          local_128 = -local_128;
          local_118 = -local_118;
        }
        fVar79 = fVar44;
        fVar64 = -fVar28;
        if (fVar44 <= fVar24) {
          fVar79 = fVar24;
          fVar64 = fVar28;
        }
        fVar33 = ABS(fVar24);
        fVar28 = 1.0 - fVar33;
        if (fVar28 < 0.0) {
          fVar28 = sqrtf(fVar28);
        }
        else {
          fVar28 = SQRT(fVar28);
        }
        fVar34 = 1.5707964 -
                 fVar28 * (((((fVar33 * -0.0043095737 + 0.0192803) * fVar33 + -0.04489909) * fVar33
                            + 0.08785567) * fVar33 + -0.21450998) * fVar33 + 1.5707952);
        fVar28 = 0.0;
        if (0.0 <= fVar34) {
          fVar28 = fVar34;
        }
        fVar28 = (float)(-(uint)(1.0 < fVar33) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar33) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar28 & -(uint)(fVar79 < 0.0) |
                                     ~-(uint)(fVar79 < 0.0) & (uint)fVar28))) * fVar25;
        auVar21 = ZEXT416((uint)(fVar28 * 0.63661975));
        auVar21 = roundss(auVar21,auVar21,9);
        uVar14 = (uint)auVar21._0_4_;
        fVar28 = fVar28 - auVar21._0_4_ * 1.5707964;
        fVar33 = fVar28 * fVar28;
        local_188._0_4_ =
             (float)(~-(uint)(fVar24 < fVar44) & (uint)fVar50 |
                    (uint)-fVar50 & -(uint)(fVar24 < fVar44));
        uVar13 = uVar14 & 3;
        fVar24 = ((((fVar33 * -2.5963018e-07 + 2.4756235e-05) * fVar33 + -0.001388833) * fVar33 +
                  0.04166664) * fVar33 + -0.5) * fVar33 + 1.0;
        fVar28 = (((((fVar33 * -2.5029328e-08 + 2.7600126e-06) * fVar33 + -0.00019842605) * fVar33 +
                   0.008333348) * fVar33 + -0.16666667) * fVar33 + 1.0) * fVar28;
        fVar44 = fVar24;
        if ((uVar14 & 1) != 0) {
          fVar44 = fVar28;
          fVar28 = fVar24;
        }
        if (uVar13 - 1 < 2) {
          fVar44 = -fVar44;
        }
        fVar52 = fVar79 * fStack_13c - local_128;
        fVar34 = fVar79 * fStack_15c - local_118;
        fVar33 = fVar79 * fStack_12c - (float)local_188;
        fVar24 = fVar79 * fStack_16c - fVar64;
        auVar47._0_8_ = CONCAT44(fStack_16c,fVar24) ^ 0x8000000000000000;
        auVar47._8_4_ = -fStack_16c;
        auVar47._12_4_ = -fStack_16c;
        auVar48._4_12_ = auVar47._4_12_;
        auVar48._0_4_ = fVar24 * fVar24 + fVar33 * fVar33 + fVar52 * fVar52 + fVar34 * fVar34;
        auVar76._0_8_ = CONCAT44(fStack_16c,auVar48._0_4_) ^ 0x8000000000000000;
        auVar76._8_4_ = -fStack_16c;
        auVar76._12_4_ = -fStack_16c;
        auVar21 = rsqrtss(auVar76,auVar48);
        fVar72 = auVar21._0_4_;
        fVar72 = fVar72 * fVar72 * auVar48._0_4_ * -0.5 * fVar72 + fVar72 * 1.5;
        if (uVar13 < 2) {
          fVar28 = -fVar28;
        }
        fVar62 = 1.0 - fVar25;
        fVar53 = fVar62 * fStack_13c + local_128 * fVar25;
        fVar70 = fVar62 * fStack_15c + local_118 * fVar25;
        fVar80 = fVar62 * fStack_12c + (float)local_188 * fVar25;
        fVar61 = fStack_16c * fVar62 + fVar64 * fVar25;
        fVar51 = fVar61 * fVar61 + fVar80 * fVar80 + fVar53 * fVar53 + fVar70 * fVar70;
        auVar82._4_4_ = fStack_16c;
        auVar82._0_4_ = fVar51;
        auVar82._8_4_ = fStack_16c;
        auVar82._12_4_ = fStack_16c;
        auVar21 = rsqrtss(auVar82,auVar82);
        fVar64 = auVar21._0_4_;
        fVar64 = fVar64 * fVar64 * fVar51 * -0.5 * fVar64 + fVar64 * 1.5;
        if (0.9995 < fVar79) {
          fVar53 = fVar53 * fVar64;
          fVar70 = fVar70 * fVar64;
          fVar80 = fVar80 * fVar64;
        }
        else {
          fVar53 = fStack_13c * fVar44 + fVar52 * fVar72 * fVar28;
          fVar70 = fStack_15c * fVar44 + fVar34 * fVar72 * fVar28;
          fVar80 = fStack_12c * fVar44 + fVar33 * fVar72 * fVar28;
        }
        fVar28 = (float)(-(uint)(0.9995 < fVar79) & (uint)(fVar61 * fVar64) |
                        ~-(uint)(0.9995 < fVar79) &
                        (uint)(fVar44 * fStack_16c + fVar24 * fVar72 * fVar28));
        local_58 = in_XMM7._0_4_;
        fStack_54 = in_XMM7._4_4_;
        fStack_50 = in_XMM7._8_4_;
        fVar86 = (float)local_168._0_4_ * fVar62 + local_58 * fVar25;
        local_78 = in_XMM9._0_4_;
        fStack_74 = in_XMM9._4_4_;
        fStack_70 = in_XMM9._8_4_;
        fVar91 = (float)local_138._0_4_ * fVar62 + local_78 * fVar25;
        fVar92 = (float)local_138._4_4_ * fVar62 + fStack_74 * fVar25;
        local_68 = in_XMM8._0_4_;
        fStack_64 = in_XMM8._4_4_;
        fStack_60 = in_XMM8._8_4_;
        fVar72 = (float)local_178._0_4_ * fVar62 + local_68 * fVar25;
        fVar61 = (float)local_178._4_4_ * fVar62 + fStack_64 * fVar25;
        fVar63 = fStack_170 * fVar62 + fStack_60 * fVar25;
        local_88 = in_XMM10._0_4_;
        fStack_84 = in_XMM10._4_4_;
        fStack_80 = in_XMM10._8_4_;
        fVar83 = fVar62 * (float)local_148._0_4_ + fVar25 * local_88;
        fVar84 = fVar62 * (float)local_148._4_4_ + fVar25 * fStack_84;
        fVar85 = fVar62 * fStack_140 + fVar25 * fStack_80;
        fVar79 = fVar53 * fVar53 + fVar70 * fVar70 + -fVar80 * fVar80 + -fVar28 * fVar28;
        fVar68 = fVar70 * fVar80 + fVar53 * fVar28;
        fVar51 = fVar70 * fVar80 - fVar53 * fVar28;
        fVar64 = fVar53 * fVar53 - fVar70 * fVar70;
        fVar69 = fVar80 * fVar80 + fVar64 + -fVar28 * fVar28;
        fVar81 = fVar70 * fVar28 - fVar53 * fVar80;
        fVar24 = fVar53 * fVar80 + fVar70 * fVar28;
        fVar65 = fVar80 * fVar28 + fVar53 * fVar70;
        fVar44 = fVar80 * fVar28 - fVar53 * fVar70;
        fVar68 = fVar68 + fVar68;
        fVar81 = fVar81 + fVar81;
        fVar64 = fVar28 * fVar28 + fVar64 + -fVar80 * fVar80;
        fVar33 = fVar79 * 1.0 + fVar68 * 0.0 + fVar81 * 0.0;
        fVar34 = fVar79 * 0.0 + fVar68 * 1.0 + fVar81 * 0.0;
        fVar52 = fVar79 * 0.0 + fVar68 * 0.0 + fVar81 * 1.0;
        fVar79 = fVar79 * 0.0 + fVar68 * 0.0 + fVar81 * 0.0;
        fVar65 = fVar65 + fVar65;
        fVar51 = fVar51 + fVar51;
        fVar80 = fVar51 * 1.0 + fVar69 * 0.0 + fVar65 * 0.0;
        fVar70 = fVar51 * 0.0 + fVar69 * 1.0 + fVar65 * 0.0;
        fVar53 = fVar51 * 0.0 + fVar69 * 0.0 + fVar65 * 1.0;
        fVar51 = fVar51 * 0.0 + fVar69 * 0.0 + fVar65 * 0.0;
        auVar49._4_4_ = fStack_160 * fVar62 + fStack_50 * fVar25;
        auVar49._0_4_ = (float)local_168._4_4_ * fVar62 + fStack_54 * fVar25;
        auVar49._8_8_ = 0;
        auVar9._4_4_ = fVar92;
        auVar9._0_4_ = fVar91;
        auVar9._8_4_ = fStack_130 * fVar62 + fStack_70 * fVar25;
        auVar9._12_4_ = fStack_12c * fVar62 + fVar50 * fVar25;
        auVar89 = blendps(auVar49,auVar9,4);
        fVar24 = fVar24 + fVar24;
        fVar44 = fVar44 + fVar44;
        fVar25 = fVar24 * 1.0 + fVar44 * 0.0 + fVar64 * 0.0;
        fVar28 = fVar24 * 0.0 + fVar44 * 1.0 + fVar64 * 0.0;
        fVar50 = fVar24 * 0.0 + fVar44 * 0.0 + fVar64 * 1.0;
        fVar44 = fVar24 * 0.0 + fVar44 * 0.0 + fVar64 * 0.0;
        fVar24 = fVar44 * 0.0;
        in_XMM14._0_4_ = fVar86 * fVar33 + fVar80 * 0.0 + fVar25 * 0.0;
        in_XMM14._4_4_ = fVar86 * fVar34 + fVar70 * 0.0 + fVar28 * 0.0;
        in_XMM14._8_4_ = fVar86 * fVar52 + fVar53 * 0.0 + fVar50 * 0.0;
        in_XMM14._12_4_ = fVar86 * fVar79 + fVar51 * 0.0 + fVar24;
        in_XMM1._0_4_ = fVar91 * fVar33 + fVar92 * fVar80 + fVar25 * 0.0;
        in_XMM1._4_4_ = fVar91 * fVar34 + fVar92 * fVar70 + fVar28 * 0.0;
        in_XMM1._8_4_ = fVar91 * fVar52 + fVar92 * fVar53 + fVar50 * 0.0;
        in_XMM1._12_4_ = fVar91 * fVar79 + fVar92 * fVar51 + fVar24;
        auVar21._0_4_ = fVar72 * fVar33 + fVar61 * fVar80 + fVar63 * fVar25;
        auVar21._4_4_ = fVar72 * fVar34 + fVar61 * fVar70 + fVar63 * fVar28;
        auVar21._8_4_ = fVar72 * fVar52 + fVar61 * fVar53 + fVar63 * fVar50;
        auVar21._12_4_ = fVar72 * fVar79 + fVar61 * fVar51 + fVar63 * fVar44;
        auVar45._0_4_ = fVar83 * fVar33 + fVar84 * fVar80 + fVar85 * fVar25 + auVar89._0_4_ + 0.0;
        auVar45._4_4_ = fVar83 * fVar34 + fVar84 * fVar70 + fVar85 * fVar28 + auVar89._4_4_ + 0.0;
        auVar45._8_4_ = fVar83 * fVar52 + fVar84 * fVar53 + fVar85 * fVar50 + auVar89._8_4_ + 0.0;
      }
      else {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
          in_XMM14 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
          auVar89 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
          auVar38 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
          auVar21 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
          auVar29 = auVar21._0_12_;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar12 + 4);
          in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12);
          in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
          in_XMM14._12_4_ = 0.0;
          auVar89._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
          auVar89._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0xc);
          auVar89._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
          auVar89._12_4_ = 0;
          auVar38._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar38._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar38._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar38._12_4_ = 0;
          uVar1 = *(ulong *)(pcVar7 + lVar12 + 0x28);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar1;
          auVar29._4_4_ = (int)uVar1;
          auVar29._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar12 + 0x24);
          auVar29._8_4_ = (int)(uVar1 >> 0x20);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
          auVar21 = insertps(auVar19,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
          auVar88._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
          auVar88._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          auVar88._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
          auVar88._12_4_ = 0;
          auVar30._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar30._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar30._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar30._12_4_ = 0;
          fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
          fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
          fVar28 = *(float *)(pcVar7 + lVar12 + 0x2c);
          fVar50 = *(float *)(pcVar7 + lVar12 + 0x30);
          in_XMM4 = ZEXT416((uint)fVar50);
          fVar79 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar89 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
          fVar64 = auVar89._0_4_;
          auVar56._4_12_ = auVar89._4_12_;
          fVar64 = fVar64 * fVar64 * fVar79 * -0.5 * fVar64 + fVar64 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar44 * fVar64));
          auVar89 = insertps(auVar30,in_XMM6,0x30);
          auVar29 = auVar89._0_12_;
          in_XMM14 = insertps(auVar88,ZEXT416((uint)(fVar24 * fVar64)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar28 * fVar64));
          auVar56._0_4_ = fVar64 * fVar50;
          auVar54 = auVar56._0_12_;
          auVar89 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
          auVar38 = insertps(auVar21,auVar56,0x30);
          auVar21 = insertps(auVar89,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
          auVar89 = insertps(auVar21,in_XMM3,0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = pRVar6->stride * uVar11;
          in_XMM14 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          auVar89 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
          auVar38 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
          auVar29 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30),0);
        }
        pRVar6 = pRVar8 + (uVar13 + 1);
        RVar4 = pRVar8[uVar13 + 1].format;
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x10),0x1c);
          in_XMM4 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x20),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 4)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x14),0x1c);
          in_XMM6 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x24),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 8)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x18),0x1c);
          in_XMM3 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x28),0x28);
          auVar21 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 0x1c),0x1c);
          auVar21 = insertps(auVar21,*(undefined4 *)(pcVar7 + lVar12 + 0x2c),0x28);
          auVar54 = auVar21._0_12_;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 4);
          in_XMM4._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 4) >> 0x20);
          in_XMM4._12_4_ = 0;
          in_XMM6._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x10);
          in_XMM6._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0xc);
          in_XMM6._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x10) >> 0x20);
          in_XMM6._12_4_ = 0;
          in_XMM3._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          in_XMM3._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          in_XMM3._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          in_XMM3._12_4_ = 0;
          auVar54._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x28);
          auVar54._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x24);
          auVar54._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x28) >> 0x20);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(pcVar7 + lVar12 + 0x10);
          auVar21 = insertps(auVar35,*(undefined4 *)(pcVar7 + lVar12 + 8),0x20);
          auVar40._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x34);
          auVar40._0_4_ = *(undefined4 *)(pcVar7 + lVar12);
          auVar40._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x34) >> 0x20);
          auVar40._12_4_ = 0;
          auVar57._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar12 + 0x1c);
          auVar57._0_4_ = *(undefined4 *)(pcVar7 + lVar12 + 0x18);
          auVar57._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar12 + 0x1c) >> 0x20);
          auVar57._12_4_ = 0;
          fVar44 = *(float *)(pcVar7 + lVar12 + 0x24);
          fVar24 = *(float *)(pcVar7 + lVar12 + 0x28);
          fVar28 = *(float *)(pcVar7 + lVar12 + 0x2c);
          fVar50 = *(float *)(pcVar7 + lVar12 + 0x30);
          fVar79 = fVar50 * fVar50 + fVar28 * fVar28 + fVar44 * fVar44 + fVar24 * fVar24;
          auVar77 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
          fVar64 = auVar77._0_4_;
          auVar78._4_12_ = auVar77._4_12_;
          fVar64 = fVar64 * fVar64 * fVar79 * -0.5 * fVar64 + fVar64 * 1.5;
          auVar77 = insertps(auVar57,ZEXT416((uint)(fVar44 * fVar64)),0x30);
          auVar54 = auVar77._0_12_;
          in_XMM4 = insertps(auVar40,ZEXT416((uint)(fVar24 * fVar64)),0x30);
          auVar78._0_4_ = fVar64 * fVar50;
          auVar77 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar12 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar12 + 4),0x10);
          in_XMM3 = insertps(auVar21,auVar78,0x30);
          auVar21 = insertps(auVar77,*(undefined4 *)(pcVar7 + lVar12 + 0x3c),0x20);
          in_XMM6 = insertps(auVar21,ZEXT416((uint)(fVar28 * fVar64)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar12 = uVar11 * pRVar6->stride;
          in_XMM4 = *(undefined1 (*) [16])(pcVar7 + lVar12);
          in_XMM6 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x10);
          in_XMM3 = *(undefined1 (*) [16])(pcVar7 + lVar12 + 0x20);
          auVar54 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar12 + 0x30),0);
        }
        fVar44 = 1.0 - fVar25;
        fVar24 = in_XMM14._4_4_;
        fVar28 = in_XMM14._8_4_;
        fVar50 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar44 + in_XMM4._0_4_ * fVar25;
        in_XMM14._4_4_ = fVar24 * fVar44 + in_XMM4._4_4_ * fVar25;
        in_XMM14._8_4_ = fVar28 * fVar44 + in_XMM4._8_4_ * fVar25;
        in_XMM14._12_4_ = fVar50 * fVar44 + in_XMM4._12_4_ * fVar25;
        in_XMM1._0_4_ = auVar89._0_4_ * fVar44 + in_XMM6._0_4_ * fVar25;
        in_XMM1._4_4_ = auVar89._4_4_ * fVar44 + in_XMM6._4_4_ * fVar25;
        in_XMM1._8_4_ = auVar89._8_4_ * fVar44 + in_XMM6._8_4_ * fVar25;
        in_XMM1._12_4_ = auVar89._12_4_ * fVar44 + in_XMM6._12_4_ * fVar25;
        auVar21._0_4_ = auVar38._0_4_ * fVar44 + in_XMM3._0_4_ * fVar25;
        auVar21._4_4_ = auVar38._4_4_ * fVar44 + in_XMM3._4_4_ * fVar25;
        auVar21._8_4_ = auVar38._8_4_ * fVar44 + in_XMM3._8_4_ * fVar25;
        auVar21._12_4_ = auVar38._12_4_ * fVar44 + in_XMM3._12_4_ * fVar25;
        auVar45._0_4_ = fVar44 * auVar29._0_4_ + fVar25 * auVar54._0_4_;
        auVar45._4_4_ = fVar44 * auVar29._4_4_ + fVar25 * auVar54._4_4_;
        auVar45._8_4_ = fVar44 * auVar29._8_4_ + fVar25 * auVar54._8_4_;
      }
    }
    fVar44 = auVar21._0_4_;
    fVar24 = auVar21._4_4_;
    fVar25 = auVar21._8_4_;
    fVar28 = auVar21._12_4_;
    fVar50 = in_XMM1._0_4_;
    fVar64 = in_XMM1._4_4_;
    fVar79 = in_XMM1._8_4_;
    auVar31._0_4_ = fVar50 * fVar24 - fVar44 * fVar64;
    fVar33 = fVar64 * fVar25 - fVar24 * fVar79;
    fVar34 = fVar79 * fVar44 - fVar25 * fVar50;
    auVar36._4_4_ = fVar34;
    auVar36._0_4_ = fVar33;
    auVar36._8_4_ = auVar31._0_4_;
    auVar36._12_4_ = in_XMM1._12_4_ * fVar28 - fVar28 * in_XMM1._12_4_;
    fVar52 = in_XMM14._0_4_;
    fVar72 = in_XMM14._4_4_;
    fVar80 = in_XMM14._8_4_;
    auVar20._0_4_ = fVar44 * fVar72 - fVar24 * fVar52;
    auVar20._4_4_ = fVar24 * fVar80 - fVar25 * fVar72;
    auVar20._8_4_ = fVar25 * fVar52 - fVar44 * fVar80;
    auVar20._12_4_ = fVar28 * in_XMM14._12_4_ - fVar28 * in_XMM14._12_4_;
    fVar44 = fVar79 * fVar72 - fVar80 * fVar64;
    auVar89 = dpps(in_XMM14,auVar36,0x7f);
    auVar27._4_4_ = fVar44;
    auVar27._0_4_ = fVar33;
    auVar21 = insertps(auVar20,auVar20,0x4a);
    auVar31._4_4_ = auVar20._0_4_;
    auVar31._8_4_ = fVar64 * fVar52 - fVar72 * fVar50;
    auVar31._12_4_ = 0;
    auVar27._8_4_ = fVar44;
    auVar27._12_4_ = auVar21._4_4_;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._4_4_ = auVar21._0_4_;
    auVar26._0_4_ = fVar33;
    auVar37._4_4_ = auVar21._8_4_;
    auVar37._0_4_ = fVar34;
    auVar37._8_4_ = fVar50 * fVar80 - fVar52 * fVar79;
    auVar37._12_4_ = auVar21._12_4_;
    auVar90._0_4_ = auVar89._0_4_;
    auVar90._4_4_ = auVar90._0_4_;
    auVar90._8_4_ = auVar90._0_4_;
    auVar90._12_4_ = auVar90._0_4_;
    auVar21 = divps(auVar26,auVar90);
    auVar38 = divps(auVar37,auVar90);
    auVar89 = divps(auVar31,auVar90);
    fVar70 = auVar45._0_4_;
    fVar53 = auVar45._4_4_;
    fVar62 = auVar45._8_4_;
    fVar50 = auVar89._0_4_;
    fVar64 = auVar89._4_4_;
    fVar79 = auVar89._8_4_;
    fVar33 = auVar89._12_4_;
    fVar34 = auVar38._0_4_;
    fVar52 = auVar38._4_4_;
    fVar72 = auVar38._8_4_;
    fVar80 = auVar38._12_4_;
    fVar44 = auVar21._0_4_;
    fVar24 = auVar21._4_4_;
    fVar25 = auVar21._8_4_;
    fVar28 = auVar21._12_4_;
    aVar2 = (ray->super_RayK<1>).org.field_0.field_1;
    fVar51 = aVar2.x;
    fVar61 = aVar2.y;
    fVar63 = aVar2.z;
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar65 = aVar3.x;
    fVar68 = aVar3.y;
    fVar69 = aVar3.z;
    auVar41._0_4_ =
         fVar51 * fVar44 +
         fVar61 * fVar34 + (fVar63 * fVar50 - (fVar70 * fVar44 + fVar53 * fVar34 + fVar62 * fVar50))
    ;
    auVar41._4_4_ =
         fVar51 * fVar24 +
         fVar61 * fVar52 + (fVar63 * fVar64 - (fVar70 * fVar24 + fVar53 * fVar52 + fVar62 * fVar64))
    ;
    auVar41._8_4_ =
         fVar51 * fVar25 +
         fVar61 * fVar72 + (fVar63 * fVar79 - (fVar70 * fVar25 + fVar53 * fVar72 + fVar62 * fVar79))
    ;
    auVar41._12_4_ =
         fVar51 * fVar28 +
         fVar61 * fVar80 + (fVar63 * fVar33 - (fVar70 * fVar28 + fVar53 * fVar80 + fVar62 * fVar33))
    ;
    aVar42.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar41,aVar2,8);
    (ray->super_RayK<1>).org.field_0 = aVar42;
    auVar22._0_4_ = fVar65 * fVar44 + fVar68 * fVar34 + fVar69 * fVar50;
    auVar22._4_4_ = fVar65 * fVar24 + fVar68 * fVar52 + fVar69 * fVar64;
    auVar22._8_4_ = fVar65 * fVar25 + fVar68 * fVar72 + fVar69 * fVar79;
    auVar22._12_4_ = fVar65 * fVar28 + fVar68 * fVar80 + fVar69 * fVar33;
    aVar42.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar22,aVar3,8);
    (ray->super_RayK<1>).dir.field_0 = aVar42;
    (**(code **)&pAVar10->field_0x78)(&(pAVar10->super_AccelData).field_0x58,ray);
    local_198 = aVar2._0_8_;
    uStack_190 = aVar2._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = local_198;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_190;
    local_188 = aVar3._0_8_;
    uStack_180 = aVar3._8_8_;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = local_188;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_180;
    pRVar5->instID[0] = 0xffffffff;
    pRVar5->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }